

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

bool tinyformat::detail::parseWidthOrPrecision
               (int *n,char **c,bool positionalMode,FormatArg *args,int *argIndex,int numArgs)

{
  int iVar1;
  runtime_error *prVar2;
  byte in_DL;
  char **in_RSI;
  int *in_RDI;
  int *in_R8;
  int in_R9D;
  int pos;
  
  if ((**in_RSI < '0') || ('9' < **in_RSI)) {
    if (**in_RSI != '*') {
      return false;
    }
    *in_RSI = *in_RSI + 1;
    *in_RDI = 0;
    if ((in_DL & 1) == 0) {
      if (in_R9D <= *in_R8) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar2,"tinyformat: Not enough arguments to read variable width or precision");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *in_R8 = *in_R8 + 1;
      iVar1 = FormatArg::toInt((FormatArg *)0x119fdb);
      *in_RDI = iVar1;
    }
    else {
      iVar1 = parseIntAndAdvance(in_RSI);
      if (**in_RSI != '$') {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar2,"tinyformat: Non-positional argument used after a positional one");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((iVar1 + -1 < 0) || (in_R9D <= iVar1 + -1)) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"tinyformat: Positional argument out of range");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = FormatArg::toInt((FormatArg *)0x119f36);
      *in_RDI = iVar1;
      *in_RSI = *in_RSI + 1;
    }
  }
  else {
    iVar1 = parseIntAndAdvance(in_RSI);
    *in_RDI = iVar1;
  }
  return true;
}

Assistant:

inline bool parseWidthOrPrecision(int& n, const char*& c, bool positionalMode,
                                  const detail::FormatArg* args,
                                  int& argIndex, int numArgs)
{
    if (*c >= '0' && *c <= '9') {
        n = parseIntAndAdvance(c);
    }
    else if (*c == '*') {
        ++c;
        n = 0;
        if (positionalMode) {
            int pos = parseIntAndAdvance(c) - 1;
            if (*c != '$')
                TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
            if (pos >= 0 && pos < numArgs)
                n = args[pos].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
        }
        else {
            if (argIndex < numArgs)
                n = args[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width or precision");
        }
    }
    else {
        return false;
    }
    return true;
}